

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmres.h
# Opt level: O2

int GMRES<TPZMatrix<double>,TPZFMatrix<double>,TPZMatrixSolver<double>,TPZFMatrix<double>,double>
              (TPZMatrix<double> *A,TPZFMatrix<double> *x,TPZFMatrix<double> *b,
              TPZMatrixSolver<double> *M,TPZFMatrix<double> *H,int *m,int64_t *max_iter,double *tol,
              TPZFMatrix<double> *residual,int FromCurrent)

{
  undefined1 auVar1 [16];
  ulong *puVar2;
  TPZFMatrix<double> *v;
  TPZFMatrix<double> *pTVar3;
  long lVar4;
  int64_t iVar5;
  double *pdVar6;
  double *pdVar7;
  ostream *poVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  TPZFMatrix<double> *pTVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  TPZFMatrix<double> *A_00;
  ulong uVar17;
  long row;
  double dVar18;
  double dVar19;
  double local_420;
  double local_418;
  TPZFMatrix<double> w;
  TPZFMatrix<double> s;
  TPZFMatrix<double> sn;
  TPZFMatrix<double> cs;
  TPZFMatrix<double> w1;
  TPZFMatrix<double> resbackup;
  
  TPZFMatrix<double>::TPZFMatrix(&s,(long)*m + 1,1);
  TPZFMatrix<double>::TPZFMatrix(&cs,(long)*m + 1,1);
  TPZFMatrix<double>::TPZFMatrix(&sn,(long)*m + 1,1);
  TPZFMatrix<double>::TPZFMatrix(&w1);
  TPZFMatrix<double>::TPZFMatrix(&w);
  TPZFMatrix<double>::TPZFMatrix(&resbackup);
  A_00 = residual;
  if (residual == (TPZFMatrix<double> *)0x0) {
    A_00 = &resbackup;
  }
  (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,b,A_00,0);
  dVar18 = Norm(A_00);
  if (FromCurrent == 0) {
    (*(x->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])();
    TPZFMatrix<double>::operator=(A_00,b);
  }
  else {
    (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])
              (0xbff0000000000000,A,x,b,A_00,0);
  }
  (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,A_00,&w,0);
  TPZFMatrix<double>::operator=(A_00,&w);
  local_418 = Norm(A_00);
  local_420 = Norm(A_00);
  dVar18 = (double)(~-(ulong)(dVar18 == 0.0) & (ulong)dVar18 |
                   -(ulong)(dVar18 == 0.0) & 0x3ff0000000000000);
  local_420 = local_420 / dVar18;
  if (local_420 <= *tol) {
    *tol = local_420;
    TPZFMatrix<double>::operator+=(x,&A_00->super_TPZMatrix<double>);
    *max_iter = 0;
  }
  else {
    iVar9 = *m;
    uVar17 = (ulong)(iVar9 + 1);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar17;
    uVar16 = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x90),8) == 0) {
      uVar16 = SUB168(auVar1 * ZEXT816(0x90),0) | 8;
    }
    puVar2 = (ulong *)operator_new__(uVar16);
    *puVar2 = uVar17;
    v = (TPZFMatrix<double> *)(puVar2 + 1);
    if (iVar9 + 1 != 0) {
      lVar10 = 0;
      pTVar3 = v;
      do {
        TPZFMatrix<double>::TPZFMatrix(pTVar3);
        lVar10 = lVar10 + -0x90;
        pTVar3 = pTVar3 + 1;
      } while (uVar17 * -0x90 - lVar10 != 0);
    }
    pTVar3 = &resbackup;
    if (residual != (TPZFMatrix<double> *)0x0) {
      pTVar3 = residual;
    }
    lVar10 = 1;
    do {
      lVar11 = 1;
      if (*max_iter < lVar10) {
        *tol = local_420;
        uVar17 = *puVar2 * 0x90;
        uVar16 = uVar17 + 8;
        uVar15 = *puVar2;
        while (uVar15 != 0) {
          TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)((long)puVar2 + (uVar17 - 0x88)));
          uVar17 = uVar17 - 0x90;
          uVar15 = uVar17;
        }
        operator_delete__(puVar2,uVar16);
        iVar9 = 1;
        goto LAB_00d0638a;
      }
      lVar12 = (pTVar3->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      (*(v->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
                (v,lVar12,1);
      if (lVar12 < 1) {
        lVar12 = 0;
      }
      for (lVar4 = 0; lVar12 != lVar4; lVar4 = lVar4 + 1) {
        *(double *)(puVar2[5] + lVar4 * 8) = pTVar3->fElem[lVar4] * (1.0 / local_418);
      }
      iVar5 = s.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow;
      if (s.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) {
        iVar5 = 0;
      }
      for (lVar12 = 0; iVar5 != lVar12; lVar12 = lVar12 + 1) {
        s.fElem[lVar12] = 0.0;
      }
      *s.fElem = local_418;
      lVar12 = 0;
LAB_00d05f02:
      if ((lVar12 < *m) && (lVar10 <= *max_iter)) {
        (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])(A,v + lVar12,&w1,0);
        (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,&w1,&w,0);
        pTVar13 = v;
        for (lVar4 = 0; lVar11 != lVar4; lVar4 = lVar4 + 1) {
          dVar19 = Dot<double>(&w,pTVar13);
          pdVar6 = TPZFMatrix<double>::operator()(H,lVar4,lVar12);
          *pdVar6 = dVar19;
          pdVar6 = TPZFMatrix<double>::operator()(H,lVar4,lVar12);
          TPZFMatrix<double>::ZAXPY(&w,-*pdVar6,pTVar13);
          pTVar13 = pTVar13 + 1;
        }
        dVar19 = Norm(&w);
        lVar4 = lVar12 + 1;
        pdVar6 = TPZFMatrix<double>::operator()(H,lVar4,lVar12);
        *pdVar6 = dVar19;
        pTVar13 = v + lVar4;
        TPZFMatrix<double>::operator=(pTVar13,&w);
        pdVar6 = TPZFMatrix<double>::operator()(H,lVar4,lVar12);
        (*(pTVar13->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x26])(1.0 / *pdVar6,pTVar13);
        lVar14 = 0;
        row = 0;
        while (lVar12 != row) {
          pdVar6 = TPZFMatrix<double>::operator()(H,row,lVar12);
          row = row + 1;
          pdVar7 = TPZFMatrix<double>::operator()(H,row,lVar12);
          ApplyPlaneRotation<double>
                    (pdVar6,pdVar7,(double *)((long)cs.fElem + lVar14),
                     (double *)((long)sn.fElem + lVar14));
          lVar14 = lVar14 + 8;
        }
        pdVar6 = TPZFMatrix<double>::operator()(H,lVar12,lVar12);
        pdVar7 = TPZFMatrix<double>::operator()(H,lVar4,lVar12);
        GeneratePlaneRotation<double>(pdVar6,pdVar7,cs.fElem + lVar12,sn.fElem + lVar12);
        pdVar6 = TPZFMatrix<double>::operator()(H,lVar12,lVar12);
        pdVar7 = TPZFMatrix<double>::operator()(H,lVar4,lVar12);
        ApplyPlaneRotation<double>(pdVar6,pdVar7,cs.fElem + lVar12,sn.fElem + lVar12);
        ApplyPlaneRotation<double>
                  (s.fElem + lVar12,s.fElem + lVar4,cs.fElem + lVar12,sn.fElem + lVar12);
        dVar19 = s.fElem[lVar4];
        if (*tol <= ABS(dVar19) / dVar18) goto code_r0x00d0619c;
        Update<TPZFMatrix<double>,TPZFMatrix<double>>(x,lVar12,H,&s,v);
        *tol = ABS(dVar19) / dVar18;
        *max_iter = lVar10;
        uVar15 = *puVar2 * 0x90;
        uVar16 = uVar15;
        uVar17 = *puVar2;
        while (uVar17 != 0) {
          TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)((long)puVar2 + (uVar16 - 0x88)));
          uVar16 = uVar16 - 0x90;
          uVar17 = uVar16;
        }
        goto LAB_00d0637c;
      }
      Update<TPZFMatrix<double>,TPZFMatrix<double>>(x,(long)*m + -1,H,&s,v);
      (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])
                (0xbff0000000000000,0x3ff0000000000000,A,x,b,A_00,0);
      (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,A_00,A_00,0);
      local_418 = Norm(A_00);
      local_420 = local_418 / dVar18;
    } while (*tol <= local_420);
    poVar8 = std::operator<<((ostream *)&std::cout,"iter ");
    poVar8 = std::ostream::_M_insert<long>((long)poVar8);
    std::operator<<(poVar8," - ");
    poVar8 = std::ostream::_M_insert<double>(local_420);
    std::endl<char,std::char_traits<char>>(poVar8);
    *tol = local_420;
    *max_iter = lVar10;
    uVar15 = *puVar2 * 0x90;
    uVar16 = uVar15;
    uVar17 = *puVar2;
    while (uVar17 != 0) {
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)((long)puVar2 + (uVar16 - 0x88)));
      uVar16 = uVar16 - 0x90;
      uVar17 = uVar16;
    }
LAB_00d0637c:
    operator_delete__(puVar2,uVar15 + 8);
  }
  iVar9 = 0;
LAB_00d0638a:
  TPZFMatrix<double>::~TPZFMatrix(&resbackup);
  TPZFMatrix<double>::~TPZFMatrix(&w);
  TPZFMatrix<double>::~TPZFMatrix(&w1);
  TPZFMatrix<double>::~TPZFMatrix(&sn);
  TPZFMatrix<double>::~TPZFMatrix(&cs);
  TPZFMatrix<double>::~TPZFMatrix(&s);
  return iVar9;
code_r0x00d0619c:
  lVar10 = lVar10 + 1;
  lVar11 = lVar11 + 1;
  lVar12 = lVar4;
  goto LAB_00d05f02;
}

Assistant:

int 
GMRES( Operator &A, Vector &x, const Vector &b,
	  Preconditioner &M, Matrix &H, int &m, int64_t &max_iter,
	  Real &tol, Vector *residual,const int FromCurrent)
{
	Real resid;
	int64_t j = 1, k;
	Vector s(m+1), cs(m+1), sn(m+1), w1,w;
	
	//  Real normb = norm(M.Solve(b));
	Vector resbackup;
	Vector *res = residual;
	if(!res) res = &resbackup;
	Vector &r = *res;
    M.Solve(b,r);
	Real normb = TPZExtractVal::val(Norm(r));	//  Vector r = b - A*x;
	if(FromCurrent) 
    {
        A.MultAdd(x,b,r,-1.,1.);
    } 
    else 
    {
		x.Zero();
		r = b;
	}
	M.Solve(r,w);
	r=w;
	Real beta = TPZExtractVal::val(Norm(r));
	
	if (normb == 0.0)
		normb = 1;
	
	if ((resid = ((Real)TPZExtractVal::val(Norm(r))) / normb) <= tol) {
		tol = resid;
		x+=r;
		max_iter = 0;
		return 0;
	}
	
	Vector *v = new Vector[m+1];
	
	while (j <= max_iter) {
        int64_t rows = r.Rows();
        v[0].Resize(rows,1);
        for (int64_t i=0; i<rows; i++) {
            v[0](i) = TPZExtractVal::val(r(i)) * ((Real)(1.0/beta));
        }
        int64_t srows = s.Rows();
        for (int64_t i=0; i<srows; i++) {
            s(i) = REAL(0.);
        }
//		v[0] = r * (REAL(1.0 / beta));    // ??? r / beta
//		s = REAL(0.0);
		s(0) = beta;
		
		for (int64_t i = 0; i < m && j <= max_iter; i++, j++) {
			A.Multiply(v[i],w1);
			M.Solve(w1,w);
			for (k = 0; k <= i; k++) {
				H(k, i) = Dot(w, v[k]);
				w.ZAXPY(-H(k, i), v[k]);
			}
			H(i+1, i) = Norm(w);
			v[i+1] = w;
			v[i+1] *= (1.0)/TPZExtractVal::val(H(i+1,i));
			
			for (k = 0; k < i; k++)
				ApplyPlaneRotation(H(k,i), H(k+1,i), cs(k), sn(k));
			
			GeneratePlaneRotation(H(i,i), H(i+1,i), cs(i), sn(i));
			ApplyPlaneRotation(H(i,i), H(i+1,i), cs(i), sn(i));
			ApplyPlaneRotation(s(i), s(i+1), cs(i), sn(i));
			resid = ((Real)fabs(s(i+1)))/normb;
			if (resid < tol) {
				Update(x, i, H, s, v);
				tol = resid;
				max_iter = j;
				delete [] v;
				return 0;
			}
		}
		Update(x, m - 1, H, s, v);
		A.MultAdd(x,b,r,-1.,1.);
		M.Solve(r,r);
		beta = TPZExtractVal::val(Norm(r));
        resid = beta/normb;
		if (resid < tol) {
            std::cout << "iter " << j << " - " << resid << std::endl;
			tol = resid;
			max_iter = j;
			delete [] v;
			return 0;
		}
	}
	
	tol = resid;
	delete [] v;
	return 1;
}